

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void add_intrinsic_SAME1_ANYfi_SAME1(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *dt_5;
  MOJOSHADER_astDataType *dt_4;
  MOJOSHADER_astDataType *dt_3;
  MOJOSHADER_astDataType *dt_2;
  MOJOSHADER_astDataType *dt_1;
  MOJOSHADER_astDataType *dt;
  char *fn_local;
  Context_conflict *ctx_local;
  
  pMVar1 = &ctx->dt_uint;
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = &ctx->dt_int;
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar1);
  add_intrinsic_SAME1_ANYf_SAME1(ctx,fn);
  return;
}

Assistant:

static void add_intrinsic_SAME1_ANYfi_SAME1(Context *ctx, const char *fn)
{
    ADD_INTRINSIC_ANY_INT(add_intrinsic2(ctx, fn, dt, dt, dt));
    add_intrinsic_SAME1_ANYf_SAME1(ctx, fn);
}